

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

time_t cs_impl::runtime_cs_ext::time(time_t *__timer)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = lVar1 - cov::timer::m_timer;
  *(undefined1 *)(__timer + 2) = 1;
  *__timer = lVar1 / 1000000;
  return (time_t)__timer;
}

Assistant:

numeric time()
		{
			return cov::timer::time(cov::timer::time_unit::milli_sec);
		}